

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::RsRuleSyntax::setChild(RsRuleSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  SyntaxNode *pSVar2;
  RandJoinClauseSyntax *pRVar3;
  SyntaxList<slang::syntax::RsProdSyntax> *pSVar4;
  RsWeightClauseSyntax *pRVar5;
  logic_error *this_00;
  allocator<char> local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (index == 2) {
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      pRVar5 = (RsWeightClauseSyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
      pRVar5 = SyntaxNode::as<slang::syntax::RsWeightClauseSyntax>(pSVar2);
    }
    this->weightClause = pRVar5;
  }
  else if (index == 1) {
    pSVar2 = TokenOrSyntax::node(&child);
    pSVar4 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::RsProdSyntax>>(pSVar2);
    (this->prods).super_SyntaxListBase.super_SyntaxNode.parent =
         (pSVar4->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->prods).super_SyntaxListBase.super_SyntaxNode.kind =
         (pSVar4->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->prods).super_SyntaxListBase.childCount = (pSVar4->super_SyntaxListBase).childCount;
    sVar1 = (pSVar4->super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>).size_;
    (this->prods).super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>.data_ =
         (pSVar4->super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>).data_;
    (this->prods).super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>.size_ = sVar1;
  }
  else {
    if (index != 0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
                 ,&local_d9);
      std::operator+(&local_98,&local_b8,":");
      std::__cxx11::to_string(&local_d8,0x2cac);
      std::operator+(&local_78,&local_98,&local_d8);
      std::operator+(&local_58,&local_78,": ");
      std::operator+(&local_38,&local_58,"Default case should be unreachable!");
      std::logic_error::logic_error(this_00,(string *)&local_38);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      pRVar3 = (RandJoinClauseSyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
      pRVar3 = SyntaxNode::as<slang::syntax::RandJoinClauseSyntax>(pSVar2);
    }
    this->randJoin = pRVar3;
  }
  return;
}

Assistant:

void RsRuleSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: randJoin = child.node() ? &child.node()->as<RandJoinClauseSyntax>() : nullptr; return;
        case 1: prods = child.node()->as<SyntaxList<RsProdSyntax>>(); return;
        case 2: weightClause = child.node() ? &child.node()->as<RsWeightClauseSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}